

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_funcbc(lua_State *L)

{
  uint uVar1;
  GCproto *pGVar2;
  long in_RDI;
  BCOp op;
  BCIns ins;
  BCPos pc;
  GCproto *pt;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_20;
  
  pGVar2 = check_Lproto((lua_State *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        in_stack_ffffffffffffffc4);
  uVar1 = lj_lib_checkint((lua_State *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                          ,in_stack_ffffffffffffffc4);
  if (uVar1 < pGVar2->sizebc) {
    uVar1 = (&pGVar2[1].nextgc)[uVar1].gcptr32;
    **(double **)(in_RDI + 0x18) = (double)(int)uVar1;
    *(double *)(*(long *)(in_RDI + 0x18) + 8) = (double)lj_bc_mode[uVar1 & 0xff];
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 0x10;
    local_20 = 2;
  }
  else {
    local_20 = 0;
  }
  return local_20;
}

Assistant:

LJLIB_CF(jit_util_funcbc)
{
  GCproto *pt = check_Lproto(L, 0);
  BCPos pc = (BCPos)lj_lib_checkint(L, 2);
  if (pc < pt->sizebc) {
    BCIns ins = proto_bc(pt)[pc];
    BCOp op = bc_op(ins);
    lj_assertL(op < BC__MAX, "bad bytecode op %d", op);
    setintV(L->top, ins);
    setintV(L->top+1, lj_bc_mode[op]);
    L->top += 2;
    return 2;
  }
  return 0;
}